

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jdmaster.c
# Opt level: O3

void jinit_master_decompress(j_decompress_ptr cinfo)

{
  JSAMPLE *pJVar1;
  jpeg_decomp_master *pjVar2;
  jpeg_error_mgr *pjVar3;
  jpeg_decomp_master *pjVar4;
  jpeg_progress_mgr *pjVar5;
  boolean bVar6;
  void *__s;
  int iVar7;
  uint need_full_buffer;
  long lVar8;
  JSAMPLE JVar9;
  JSAMPLE JVar10;
  JSAMPLE JVar11;
  JSAMPLE JVar12;
  JSAMPLE JVar13;
  JSAMPLE JVar14;
  JSAMPLE JVar15;
  JSAMPLE JVar16;
  JSAMPLE JVar17;
  JSAMPLE JVar18;
  JSAMPLE JVar19;
  JSAMPLE JVar20;
  JSAMPLE JVar21;
  JSAMPLE JVar22;
  JSAMPLE JVar23;
  JSAMPLE JVar24;
  
  pjVar2 = cinfo->master;
  pjVar2->prepare_for_output_pass = prepare_for_output_pass;
  pjVar2->finish_output_pass = finish_output_pass;
  lVar8 = 0;
  pjVar2->is_dummy_pass = 0;
  pjVar2->jinit_upsampler_no_alloc = 0;
  jpeg_calc_output_dimensions(cinfo);
  __s = (*cinfo->mem->alloc_small)((j_common_ptr)cinfo,1,0x580);
  cinfo->sample_range_limit = (JSAMPLE *)((long)__s + 0x100);
  memset(__s,0,0x100);
  JVar9 = '\0';
  JVar10 = '\x01';
  JVar11 = '\x02';
  JVar12 = '\x03';
  JVar13 = '\x04';
  JVar14 = '\x05';
  JVar15 = '\x06';
  JVar16 = '\a';
  JVar17 = '\b';
  JVar18 = '\t';
  JVar19 = '\n';
  JVar20 = '\v';
  JVar21 = '\f';
  JVar22 = '\r';
  JVar23 = '\x0e';
  JVar24 = '\x0f';
  do {
    pJVar1 = (JSAMPLE *)((long)__s + 0x100) + lVar8;
    *pJVar1 = JVar9;
    pJVar1[1] = JVar10;
    pJVar1[2] = JVar11;
    pJVar1[3] = JVar12;
    pJVar1[4] = JVar13;
    pJVar1[5] = JVar14;
    pJVar1[6] = JVar15;
    pJVar1[7] = JVar16;
    pJVar1[8] = JVar17;
    pJVar1[9] = JVar18;
    pJVar1[10] = JVar19;
    pJVar1[0xb] = JVar20;
    pJVar1[0xc] = JVar21;
    pJVar1[0xd] = JVar22;
    pJVar1[0xe] = JVar23;
    pJVar1[0xf] = JVar24;
    lVar8 = lVar8 + 0x10;
    JVar9 = JVar9 + '\x10';
    JVar10 = JVar10 + '\x10';
    JVar11 = JVar11 + '\x10';
    JVar12 = JVar12 + '\x10';
    JVar13 = JVar13 + '\x10';
    JVar14 = JVar14 + '\x10';
    JVar15 = JVar15 + '\x10';
    JVar16 = JVar16 + '\x10';
    JVar17 = JVar17 + '\x10';
    JVar18 = JVar18 + '\x10';
    JVar19 = JVar19 + '\x10';
    JVar20 = JVar20 + '\x10';
    JVar21 = JVar21 + '\x10';
    JVar22 = JVar22 + '\x10';
    JVar23 = JVar23 + '\x10';
    JVar24 = JVar24 + '\x10';
  } while (lVar8 != 0x100);
  memset((void *)((long)__s + 0x200),0xff,0x180);
  memset((void *)((long)__s + 0x380),0,0x180);
  memcpy((void *)((long)__s + 0x500),cinfo->sample_range_limit,0x80);
  if ((long)cinfo->out_color_components * (ulong)cinfo->output_width >> 0x20 != 0) {
    pjVar3 = cinfo->err;
    pjVar3->msg_code = 0x46;
    (*pjVar3->error_exit)((j_common_ptr)cinfo);
  }
  *(undefined4 *)&pjVar2[1].prepare_for_output_pass = 0;
  bVar6 = use_merged_upsample(cinfo);
  *(boolean *)((long)&pjVar2[1].prepare_for_output_pass + 4) = bVar6;
  pjVar2[1].finish_output_pass = (_func_void_j_decompress_ptr *)0x0;
  pjVar2[1].is_dummy_pass = 0;
  pjVar2[1].first_iMCU_col = 0;
  if (cinfo->quantize_colors == 0) {
    cinfo->enable_1pass_quant = 0;
    cinfo->enable_external_quant = 0;
    cinfo->enable_2pass_quant = 0;
  }
  else {
    if (cinfo->buffered_image == 0) {
      cinfo->enable_1pass_quant = 0;
      cinfo->enable_external_quant = 0;
      cinfo->enable_2pass_quant = 0;
    }
    if (cinfo->raw_data_out != 0) {
      pjVar3 = cinfo->err;
      pjVar3->msg_code = 0x2f;
      (*pjVar3->error_exit)((j_common_ptr)cinfo);
    }
    if (cinfo->out_color_components == 3) {
      if (cinfo->colormap == (JSAMPARRAY)0x0) {
        if (cinfo->two_pass_quantize == 0) {
          cinfo->enable_1pass_quant = 1;
        }
        else {
          cinfo->enable_2pass_quant = 1;
        }
      }
      else {
        cinfo->enable_external_quant = 1;
      }
    }
    else {
      cinfo->enable_1pass_quant = 1;
      cinfo->enable_external_quant = 0;
      cinfo->enable_2pass_quant = 0;
      cinfo->colormap = (JSAMPARRAY)0x0;
    }
    if (cinfo->enable_1pass_quant != 0) {
      jinit_1pass_quantizer(cinfo);
      pjVar2[1].finish_output_pass = (_func_void_j_decompress_ptr *)cinfo->cquantize;
    }
    if ((cinfo->enable_2pass_quant != 0) || (cinfo->enable_external_quant != 0)) {
      jinit_2pass_quantizer(cinfo);
      *(jpeg_color_quantizer **)&pjVar2[1].is_dummy_pass = cinfo->cquantize;
    }
  }
  if (cinfo->raw_data_out == 0) {
    if (*(int *)((long)&pjVar2[1].prepare_for_output_pass + 4) == 0) {
      jinit_color_deconverter(cinfo);
      jinit_upsampler(cinfo);
    }
    else {
      jinit_merged_upsampler(cinfo);
    }
    jinit_d_post_controller(cinfo,cinfo->enable_2pass_quant);
  }
  jinit_inverse_dct(cinfo);
  if (cinfo->arith_code == 0) {
    if (cinfo->progressive_mode == 0) {
      jinit_huff_decoder(cinfo);
    }
    else {
      jinit_phuff_decoder(cinfo);
    }
  }
  else {
    jinit_arith_decoder(cinfo);
  }
  need_full_buffer = 1;
  if (cinfo->inputctl->has_multiple_scans == 0) {
    need_full_buffer = (uint)(cinfo->buffered_image != 0);
  }
  jinit_d_coef_controller(cinfo,need_full_buffer);
  if (cinfo->raw_data_out == 0) {
    jinit_d_main_controller(cinfo,0);
  }
  (*cinfo->mem->realize_virt_arrays)((j_common_ptr)cinfo);
  (*cinfo->inputctl->start_input_pass)(cinfo);
  pjVar4 = cinfo->master;
  pjVar4->first_iMCU_col = 0;
  pjVar4->last_iMCU_col = cinfo->MCUs_per_row - 1;
  pjVar4->last_good_iMCU_row = 0;
  pjVar5 = cinfo->progress;
  if (((pjVar5 != (jpeg_progress_mgr *)0x0) && (cinfo->buffered_image == 0)) &&
     (cinfo->inputctl->has_multiple_scans != 0)) {
    iVar7 = cinfo->num_components * 3 + 2;
    if (cinfo->progressive_mode == 0) {
      iVar7 = cinfo->num_components;
    }
    pjVar5->pass_counter = 0;
    pjVar5->pass_limit = (long)iVar7 * (ulong)cinfo->total_iMCU_rows;
    pjVar5->completed_passes = 0;
    pjVar5->total_passes = 3 - (uint)(cinfo->enable_2pass_quant == 0);
    *(int *)&pjVar2[1].prepare_for_output_pass = *(int *)&pjVar2[1].prepare_for_output_pass + 1;
  }
  return;
}

Assistant:

GLOBAL(void)
jinit_master_decompress(j_decompress_ptr cinfo)
{
  my_master_ptr master = (my_master_ptr)cinfo->master;

  master->pub.prepare_for_output_pass = prepare_for_output_pass;
  master->pub.finish_output_pass = finish_output_pass;

  master->pub.is_dummy_pass = FALSE;
  master->pub.jinit_upsampler_no_alloc = FALSE;

  master_selection(cinfo);
}